

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::TraverseSchema::getPrefix(TraverseSchema *this,XMLCh *rawName)

{
  XMLStringPool *pXVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  
  iVar2 = XMLString::indexOf(rawName,L':');
  if (iVar2 + 1U < 2) {
    return L"";
  }
  (this->fBuffer).fIndex = 0;
  XMLBuffer::append(&this->fBuffer,rawName,(long)iVar2);
  pXVar1 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  uVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1);
  iVar2 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar3);
  return (XMLCh *)CONCAT44(extraout_var,iVar2);
}

Assistant:

inline const XMLCh* TraverseSchema::getPrefix(const XMLCh* const rawName) {

    int colonIndex = XMLString::indexOf(rawName, chColon);

    if (colonIndex == -1 || colonIndex == 0) {
        return XMLUni::fgZeroLenString;
    }

    fBuffer.set(rawName, colonIndex);

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}